

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# payload.hpp
# Opt level: O2

FormatError
trackerboy::readPayloadImpl<trackerboy::CommHandler>
          (Module *mod,InputBlock *block,CommHandler *handler)

{
  size_t sVar1;
  bool bVar2;
  BlockId BVar3;
  FormatError FVar4;
  size_t i;
  size_t index;
  
  sVar1 = (handler->super_PayloadHandler<1296912195U>).mCount;
  index = 0;
  do {
    if (sVar1 == index) {
      return none;
    }
    BVar3 = InputBlock::begin(block);
    if (BVar3 != 0x4d4d4f43) {
      return invalid;
    }
    FVar4 = CommHandler::processIn(handler,mod,block,index);
    if (FVar4 != none) {
      return FVar4;
    }
    bVar2 = InputBlock::finished(block);
    index = index + 1;
  } while (bVar2);
  return invalid;
}

Assistant:

FormatError readPayloadImpl(Module &mod, InputBlock &block, T& handler) {
    auto const count = handler.count();

    // TODO: optimize this for single block handlers (ie COMM block)
    // if we only need to read 1 block, we don't need the for loop
    for (size_t i = 0; i < count; ++i) {
        if (block.begin() != handler.id()) {
            return FormatError::invalid;
        }

        auto error = handler.processIn(mod, block, i);
        if (error != FormatError::none) {
            return error;
        }

        if (!block.finished()) {
            return FormatError::invalid;
        }
    }

    return FormatError::none;
}